

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O1

bool __thiscall QJsonPrivate::Parser::parseObject(Parser *this)

{
  byte *pbVar1;
  ulong uVar2;
  anon_union_8_2_4ee71171_for_Element_0 aVar3;
  int iVar4;
  byte *pbVar5;
  QCborContainerPrivate *pQVar6;
  iterator iVar7;
  iterator iVar8;
  long lVar9;
  iterator abegin;
  QList<QtCbor::Element> *this_00;
  byte bVar10;
  anon_union_8_2_4ee71171_for_Element_0 *paVar11;
  ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator> ret;
  anon_union_8_2_4ee71171_for_Element_0 *paVar12;
  long in_FS_OFFSET;
  bool bVar13;
  anon_class_8_1_fd19d321 local_80;
  anon_union_8_2_4ee71171_for_Element_0 local_78;
  anon_union_8_2_4ee71171_for_Element_0 aStack_70;
  anon_union_8_2_4ee71171_for_Element_0 local_68;
  anon_union_8_2_4ee71171_for_Element_0 aStack_60;
  anon_union_8_2_4ee71171_for_Element_0 local_58;
  anon_union_8_2_4ee71171_for_Element_0 aStack_50;
  anon_union_8_2_4ee71171_for_Element_0 local_48;
  anon_union_8_2_4ee71171_for_Element_0 aStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = this->nestingLevel;
  this->nestingLevel = iVar4 + 1;
  if (iVar4 < 0x400) {
    pbVar5 = (byte *)this->json;
    pbVar1 = (byte *)this->end;
    bVar13 = pbVar5 < pbVar1;
    if (bVar13) {
      bVar10 = *pbVar5;
      if ((char)bVar10 < '!') {
        bVar13 = true;
        while ((pbVar5 = pbVar5 + 1, bVar10 < 0x21 &&
               ((0x100002600U >> ((ulong)bVar10 & 0x3f) & 1) != 0))) {
          this->json = (char *)pbVar5;
          bVar13 = pbVar5 < pbVar1;
          if ((pbVar5 == pbVar1) || (bVar10 = *pbVar5, ' ' < (char)bVar10)) break;
        }
        goto LAB_00116af5;
      }
LAB_00116afa:
      pbVar5 = (byte *)this->json;
      this->json = (char *)(pbVar5 + 1);
      bVar10 = *pbVar5;
      if ((((0x3b < bVar10 - 0x22) ||
           ((0xa00000001000401U >> ((ulong)(bVar10 - 0x22) & 0x3f) & 1) == 0)) && (bVar10 != 0x7b))
         && (bVar10 != 0x7d)) goto LAB_00116b23;
    }
    else {
LAB_00116af5:
      if (bVar13) goto LAB_00116afa;
LAB_00116b23:
      bVar10 = 0;
    }
    do {
      if (bVar10 != 0x22) {
LAB_00116c80:
        if (bVar10 != 0x7d) {
          this->lastError = UnterminatedObject;
          goto LAB_00116d39;
        }
        this->nestingLevel = this->nestingLevel + -1;
        pQVar6 = (this->container).d.ptr;
        bVar13 = true;
        if (pQVar6 == (QCborContainerPrivate *)0x0) goto LAB_00116d3b;
        this_00 = &pQVar6->elements;
        local_80.container = pQVar6;
        iVar7 = QList<QtCbor::Element>::begin(this_00);
        iVar8 = QList<QtCbor::Element>::end(this_00);
        if (iVar7.i != iVar8.i) {
          lVar9 = ((long)iVar8.i - (long)iVar7.i >> 4) - ((long)iVar8.i - (long)iVar7.i >> 0x3f) >>
                  1;
          local_48.container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          aStack_50.container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          std::
          _Temporary_buffer<QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>,_QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>::value_type>
          ::_Temporary_buffer((_Temporary_buffer<QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>,_QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>::value_type>
                               *)&local_58,
                              (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)
                              iVar7.i,(lVar9 - (lVar9 + 1 >> 0x3f)) + 1 >> 1);
          if ((value_type *)local_48.value == (value_type *)0x0) {
            std::
            __inplace_stable_sort<QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>,__gnu_cxx::__ops::_Iter_comp_iter<sortContainer(QCborContainerPrivate*)::__0>>
                      ((ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar7.i,
                       (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar8.i,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_serialization_qjsonparser_cpp:418:17)>
                        )&local_80);
          }
          else {
            std::
            __stable_sort_adaptive<QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>,QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>::value_type*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<sortContainer(QCborContainerPrivate*)::__0>>
                      ((ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar7.i,
                       (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar8.i,
                       (value_type *)local_48.container,aStack_50.value,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_serialization_qjsonparser_cpp:418:17)>
                        )&local_80);
          }
          operator_delete(local_48.container,aStack_50.value << 5);
        }
        iVar7 = QList<QtCbor::Element>::begin(this_00);
        abegin = QList<QtCbor::Element>::end(this_00);
        iVar8 = abegin;
        if (iVar7.i == abegin.i) goto LAB_00116e14;
        goto LAB_00116dbb;
      }
      if ((this->container).d.ptr == (QCborContainerPrivate *)0x0) {
        pQVar6 = (QCborContainerPrivate *)operator_new(0x40);
        (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 0;
        pQVar6->usedData = 0;
        (pQVar6->data).d.d = (Data *)0x0;
        (pQVar6->data).d.ptr = (char *)0x0;
        (pQVar6->data).d.size = 0;
        (pQVar6->elements).d.d = (Data *)0x0;
        (pQVar6->elements).d.ptr = (Element *)0x0;
        (pQVar6->elements).d.size = 0;
        QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->container,pQVar6);
      }
      bVar13 = parseMember(this);
      if (!bVar13) goto LAB_00116d39;
      pbVar5 = (byte *)this->json;
      pbVar1 = (byte *)this->end;
      bVar13 = pbVar5 < pbVar1;
      if (bVar13) {
        bVar10 = *pbVar5;
        if ((char)bVar10 < '!') {
          bVar13 = true;
          while ((pbVar5 = pbVar5 + 1, bVar10 < 0x21 &&
                 ((0x100002600U >> ((ulong)bVar10 & 0x3f) & 1) != 0))) {
            this->json = (char *)pbVar5;
            bVar13 = pbVar5 < pbVar1;
            if ((pbVar5 == pbVar1) || (bVar10 = *pbVar5, ' ' < (char)bVar10)) break;
          }
          goto LAB_00116bc0;
        }
LAB_00116bc5:
        pbVar5 = (byte *)this->json;
        this->json = (char *)(pbVar5 + 1);
        bVar10 = *pbVar5;
        if (((0x3b < bVar10 - 0x22) ||
            ((0xa00000001000401U >> ((ulong)(bVar10 - 0x22) & 0x3f) & 1) == 0)) &&
           ((bVar10 != 0x7b && (bVar10 != 0x7d)))) goto LAB_00116bee;
      }
      else {
LAB_00116bc0:
        if (bVar13) goto LAB_00116bc5;
LAB_00116bee:
        bVar10 = 0;
      }
      if (bVar10 != 0x2c) goto LAB_00116c80;
      pbVar5 = (byte *)this->json;
      bVar13 = pbVar5 < pbVar1;
      if (bVar13) {
        bVar10 = *pbVar5;
        if ((char)bVar10 < '!') {
          bVar13 = true;
          while ((pbVar5 = pbVar5 + 1, bVar10 < 0x21 &&
                 ((0x100002600U >> ((ulong)bVar10 & 0x3f) & 1) != 0))) {
            this->json = (char *)pbVar5;
            bVar13 = pbVar5 < pbVar1;
            if ((pbVar5 == pbVar1) || (bVar10 = *pbVar5, ' ' < (char)bVar10)) break;
          }
          goto LAB_00116c3b;
        }
LAB_00116c40:
        pbVar5 = (byte *)this->json;
        this->json = (char *)(pbVar5 + 1);
        bVar10 = *pbVar5;
        if ((((0x3b < bVar10 - 0x22) ||
             ((0xa00000001000401U >> ((ulong)(bVar10 - 0x22) & 0x3f) & 1) == 0)) && (bVar10 != 0x7b)
            ) && (bVar10 != 0x7d)) goto LAB_00116c69;
      }
      else {
LAB_00116c3b:
        if (bVar13) goto LAB_00116c40;
LAB_00116c69:
        bVar10 = 0;
      }
    } while (bVar10 != 0x7d);
    this->lastError = MissingObject;
  }
  else {
    this->lastError = DeepNesting;
  }
LAB_00116d39:
  bVar13 = false;
LAB_00116d3b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar13;
  while( true ) {
    local_58 = (iVar7.i)->field_0;
    aStack_50 = *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar7.i + 8);
    local_48 = *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar7.i + 0x10);
    aStack_40 = *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar7.i + 0x18);
    local_78 = *paVar11;
    aStack_70 = *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar7.i + 0x28);
    local_68 = *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar7.i + 0x30);
    aStack_60 = *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar7.i + 0x38);
    iVar4 = anon_func::anon_class_8_1_fd19d321::operator()
                      (&local_80,(Value *)&local_58,(Value *)&local_78);
    iVar8.i = iVar7.i;
    iVar7.i = (Element *)paVar11;
    if (iVar4 == 0) break;
LAB_00116dbb:
    paVar11 = (anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar7.i + 0x20);
    iVar8 = abegin;
    if (paVar11 == &(abegin.i)->field_0) break;
  }
LAB_00116e14:
  if (iVar8.i != abegin.i) {
    if (((((ValueFlags *)((long)iVar8.i + 0x1c))->
         super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>).
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) != 0) {
      QCborContainerPrivate::deref
                (((anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x10))->container);
    }
    (iVar8.i)->field_0 = *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x20);
    *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 8) =
         *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x28);
    *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x10) =
         *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x30);
    *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x18) =
         *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x38);
    ((anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x30))->value = 0;
    ((anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x38))->value = 0x117;
    paVar11 = (anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 0x40);
    if (paVar11 != &(abegin.i)->field_0) {
      paVar12 = &(iVar8.i)->field_0;
      do {
        local_58 = *paVar12;
        aStack_50 = paVar12[1];
        local_48 = paVar12[2];
        aStack_40 = paVar12[3];
        local_78 = *paVar11;
        aStack_70 = paVar11[1];
        local_68 = paVar11[2];
        aStack_60 = paVar11[3];
        iVar4 = anon_func::anon_class_8_1_fd19d321::operator()
                          (&local_80,(Value *)&local_58,(Value *)&local_78);
        uVar2 = (ulong)(iVar4 != 0);
        if ((*(byte *)((long)paVar12 + uVar2 * 0x20 + 0x1c) & 1) != 0) {
          QCborContainerPrivate::deref(paVar12[uVar2 * 4 + 2].container);
        }
        iVar8.i = (Element *)(paVar12 + uVar2 * 4);
        if (paVar11 != (anon_union_8_2_4ee71171_for_Element_0 *)iVar8.i) {
          aVar3 = paVar11[1];
          *(anon_union_8_2_4ee71171_for_Element_0 *)iVar8.i = *paVar11;
          *(anon_union_8_2_4ee71171_for_Element_0 *)((long)iVar8.i + 8) = aVar3;
          aVar3 = paVar11[3];
          paVar12[uVar2 * 4 + 2] = paVar11[2];
          paVar12[uVar2 * 4 + 3] = aVar3;
        }
        paVar11[2].value = 0;
        paVar11[3].value = 0x117;
        paVar11 = paVar11 + 4;
        paVar12 = (anon_union_8_2_4ee71171_for_Element_0 *)iVar8.i;
      } while (paVar11 != &(abegin.i)->field_0);
    }
    abegin.i = iVar8.i + 0x20;
  }
  iVar7 = QList<QtCbor::Element>::end(this_00);
  QList<QtCbor::Element>::erase(this_00,(const_iterator)abegin.i,(const_iterator)iVar7.i);
  bVar13 = true;
  goto LAB_00116d3b;
}

Assistant:

bool Parser::parseObject()
{
    if (++nestingLevel > nestingLimit) {
        lastError = QJsonParseError::DeepNesting;
        return false;
    }

    char token = nextToken();
    while (token == Quote) {
        if (!container)
            container = new QCborContainerPrivate;
        if (!parseMember())
            return false;
        token = nextToken();
        if (token != ValueSeparator)
            break;
        token = nextToken();
        if (token == EndObject) {
            lastError = QJsonParseError::MissingObject;
            return false;
        }
    }

    if (token != EndObject) {
        lastError = QJsonParseError::UnterminatedObject;
        return false;
    }

    --nestingLevel;

    if (container)
        sortContainer(container.data());
    return true;
}